

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

int __thiscall GrcManager::SlotAttributeIndex(GrcManager *this,Symbol psym)

{
  bool bVar1;
  GrcSymbolTableEntry *in_RSI;
  GrcSymbolTableEntry *in_RDI;
  int nIDRet;
  Symbol psymBase;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  bVar1 = GrcSymbolTableEntry::IsComponentRef(in_RDI);
  if (bVar1) {
    local_20 = GrcSymbolTableEntry::BaseLigComponent(in_RSI);
    bVar1 = GrcSymbolTableEntry::IsGeneric(local_20);
    if (!bVar1) {
      local_20 = GrcSymbolTableEntry::Generic(local_20);
    }
    iVar2 = GrcSymbolTableEntry::InternalID(local_20);
  }
  else {
    bVar1 = GrcSymbolTableEntry::IsUserDefinableSlotAttr
                      ((GrcSymbolTableEntry *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      iVar2 = GrcSymbolTableEntry::UserDefinableSlotAttrIndex
                        ((GrcSymbolTableEntry *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int GrcManager::SlotAttributeIndex(Symbol psym)
{
	if (psym->IsComponentRef())
	{
		Symbol psymBase = psym->BaseLigComponent();
		if (!psymBase->IsGeneric())
			psymBase = psymBase->Generic();
		Assert(psymBase->IsGeneric());

		int nIDRet = psymBase->InternalID();
		Assert(nIDRet > -1);
		return nIDRet;
	}
	else if (psym->IsUserDefinableSlotAttr())
	{
		return psym->UserDefinableSlotAttrIndex();
	}
	else
	{
		//	No other kinds of indexed attributes so far.
		Assert(false);
	}
	return 0;
}